

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O2

char * get_opt_value(char *line)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  
  sVar2 = strlen(line);
  do {
    pcVar3 = line + 1;
    bVar4 = sVar2 == 0;
    sVar2 = sVar2 - 1;
    if (bVar4) {
      return (char *)0x0;
    }
    cVar1 = *line;
    line = pcVar3;
  } while (cVar1 != ':');
  pcVar3 = string_trim(pcVar3);
  return pcVar3;
}

Assistant:

static char *get_opt_value(char *line)
{
    size_t i;

    for (i = 0; i < strlen(line); ++i) {
        if (line[i] == ':')
            return string_trim(&line[i + 1]);
    }

    return NULL;
}